

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_did_write(CBB *cbb,size_t len)

{
  int iVar1;
  cbb_buffer_st *pcVar2;
  ulong uVar3;
  
  pcVar2 = (cbb_buffer_st *)&cbb->u;
  if (cbb->is_child != '\0') {
    pcVar2 = ((cbb_child_st *)pcVar2)->base;
  }
  uVar3 = len + pcVar2->len;
  iVar1 = 0;
  if (((cbb->child == (CBB *)0x0) && (!CARRY8(len,pcVar2->len))) && (uVar3 <= pcVar2->cap)) {
    pcVar2->len = uVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CBB_did_write(CBB *cbb, size_t len) {
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  size_t newlen = base->len + len;
  if (cbb->child != NULL || newlen < base->len || newlen > base->cap) {
    return 0;
  }
  base->len = newlen;
  return 1;
}